

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_strnicmp(char *zLeft,char *zRight,int N)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (zLeft == (char *)0x0) {
    return -(uint)(zRight != (char *)0x0);
  }
  if (zRight == (char *)0x0) {
    return 1;
  }
  if (0 < N) {
    uVar2 = N + 1;
    lVar3 = 0;
    do {
      if ((ulong)(byte)zLeft[lVar3] == 0) {
        uVar1 = 0;
LAB_0013514b:
        return uVar1 - ""[(byte)zRight[lVar3]];
      }
      uVar1 = (uint)""[(byte)zLeft[lVar3]];
      if (""[(byte)zLeft[lVar3]] != ""[(byte)zRight[lVar3]]) goto LAB_0013514b;
      uVar2 = uVar2 - 1;
      lVar3 = lVar3 + 1;
    } while (1 < uVar2);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_strnicmp(const char *zLeft, const char *zRight, int N){
  register unsigned char *a, *b;
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( N-- > 0 && *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return N<0 ? 0 : UpperToLower[*a] - UpperToLower[*b];
}